

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,GetElementPtrInst *ptr,bool decl)

{
  bool bVar1;
  uint uVar2;
  Value *value;
  undefined7 in_register_00000011;
  uint i;
  uint index;
  uint64_t local_40;
  Type *local_38;
  char *local_30;
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_40 = Value::get_tween_id((Value *)ptr);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1a7902,&local_40);
  }
  else {
    local_40 = Value::get_tween_id((Value *)ptr);
    bVar1 = GetElementPtrInst::isInBounds(ptr);
    local_30 = "";
    if (bVar1) {
      local_30 = "inbounds ";
    }
    local_38 = Value::getType((Value *)ptr);
    append<char_const(&)[2],unsigned_long,char_const(&)[18],char_const*,LLVMBC::Type*>
              (this,(char (*) [2])0x1a7902,&local_40,(char (*) [18])" = getelementptr ",&local_30,
               &local_38);
    index = 0;
    while( true ) {
      uVar2 = Instruction::getNumOperands(&ptr->super_Instruction);
      if (uVar2 <= index) break;
      std::operator<<((ostream *)this,", ");
      value = Instruction::getOperand(&ptr->super_Instruction,index);
      append(this,value,false);
      index = index + 1;
    }
  }
  return;
}

Assistant:

void StreamState::append(GetElementPtrInst *ptr, bool decl)
{
	if (decl)
	{
		append("%", ptr->get_tween_id(), " = getelementptr ", ptr->isInBounds() ? "inbounds " : "", ptr->getType());
		for (unsigned i = 0; i < ptr->getNumOperands(); i++)
		{
			append(", ");
			append(ptr->getOperand(i));
		}
	}
	else
	{
		append("%", ptr->get_tween_id());
	}
}